

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

void lysc_update_path(lysc_ctx *ctx,lys_module *parent_module,char *name)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  
  if (name == (char *)0x0) {
    uVar2 = ctx->path_len;
    if (ctx->path[uVar2 - 1] == '}') {
      while( true ) {
        if (ctx->path[uVar2] == '=') break;
        if (ctx->path[uVar2] == '{') goto LAB_0013dce3;
        uVar2 = uVar2 - 1;
        ctx->path_len = uVar2;
      }
      uVar4 = uVar2 + 1;
      ctx->path_len = uVar4;
      ctx->path[uVar2] = '}';
    }
    else {
LAB_0013dce3:
      while (ctx->path[uVar2] != '/') {
        uVar2 = uVar2 - 1;
        ctx->path_len = uVar2;
      }
      uVar4 = uVar2;
      if (uVar2 == 0) {
        ctx->path_len = 1;
        uVar4 = 1;
      }
    }
    ctx->path[uVar4] = '\0';
    goto LAB_0013ddcf;
  }
  uVar2 = ctx->path_len;
  uVar3 = (ulong)uVar2;
  if (parent_module == (lys_module *)0x0 && 1 < uVar3) {
    uVar4 = uVar2 - 1;
    if ((ctx->path[uVar4] == '}') && (ctx->path[uVar2 - 2] != '\'')) {
      ctx->path_len = uVar4;
      iVar1 = snprintf(ctx->path + uVar4,(ulong)(0xfef - uVar2),"=\'%s\'}",name);
    }
    else {
LAB_0013dd17:
      if (*name != '{') goto LAB_0013dd54;
LAB_0013dd1d:
      pcVar5 = "";
      if (1 < uVar2) {
        pcVar5 = "/";
      }
      iVar1 = snprintf(ctx->path + uVar3,(ulong)(0xfee - uVar2),"%s%s",pcVar5,name);
    }
  }
  else {
    if (parent_module == (lys_module *)0x0) {
      if (1 < uVar2) goto LAB_0013dd17;
    }
    else if (ctx->cur_mod == parent_module) goto LAB_0013dd1d;
LAB_0013dd54:
    pcVar5 = "";
    if (1 < uVar2) {
      pcVar5 = "/";
    }
    iVar1 = snprintf(ctx->path + uVar3,(ulong)(0xfee - uVar2),"%s%s:%s",pcVar5,ctx->cur_mod->name);
  }
  if (iVar1 < (int)(0xfee - ctx->path_len)) {
    ctx->path_len = ctx->path_len + iVar1;
  }
  else {
    ctx->path_len = 0xfed;
  }
LAB_0013ddcf:
  ly_log_location_revert(0,0,1,0);
  ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,ctx->path,(ly_in *)0x0);
  return;
}

Assistant:

void
lysc_update_path(struct lysc_ctx *ctx, const struct lys_module *parent_module, const char *name)
{
    int len;
    uint8_t nextlevel = 0; /* 0 - no starttag, 1 - '/' starttag, 2 - '=' starttag + '}' endtag */

    if (!name) {
        /* removing last path segment */
        if (ctx->path[ctx->path_len - 1] == '}') {
            for ( ; ctx->path[ctx->path_len] != '=' && ctx->path[ctx->path_len] != '{'; --ctx->path_len) {}
            if (ctx->path[ctx->path_len] == '=') {
                ctx->path[ctx->path_len++] = '}';
            } else {
                /* not a top-level special tag, remove also preceiding '/' */
                goto remove_nodelevel;
            }
        } else {
remove_nodelevel:
            for ( ; ctx->path[ctx->path_len] != '/'; --ctx->path_len) {}
            if (ctx->path_len == 0) {
                /* top-level (last segment) */
                ctx->path_len = 1;
            }
        }
        /* set new terminating NULL-byte */
        ctx->path[ctx->path_len] = '\0';
    } else {
        if (ctx->path_len > 1) {
            if (!parent_module && (ctx->path[ctx->path_len - 1] == '}') && (ctx->path[ctx->path_len - 2] != '\'')) {
                /* extension of the special tag */
                nextlevel = 2;
                --ctx->path_len;
            } else {
                /* there is already some path, so add next level */
                nextlevel = 1;
            }
        } /* else the path is just initiated with '/', so do not add additional slash in case of top-level nodes */

        if (nextlevel != 2) {
            if ((parent_module && (parent_module == ctx->cur_mod)) || (!parent_module && (ctx->path_len > 1) && (name[0] == '{'))) {
                /* module not changed, print the name unprefixed */
                len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "%s%s",
                        nextlevel ? "/" : "", name);
            } else {
                len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "%s%s:%s",
                        nextlevel ? "/" : "", ctx->cur_mod->name, name);
            }
        } else {
            len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "='%s'}", name);
        }
        if (len >= LYSC_CTX_BUFSIZE - (int)ctx->path_len) {
            /* output truncated */
            ctx->path_len = LYSC_CTX_BUFSIZE - 1;
        } else {
            ctx->path_len += len;
        }
    }

    ly_log_location_revert(0, 0, 1, 0);
    ly_log_location(NULL, NULL, ctx->path, NULL);
}